

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_mysql.cpp
# Opt level: O3

bool __thiscall QMYSQLResult::reset(QMYSQLResult *this,QString *query)

{
  QList<QMYSQLResultPrivate::QMyField> *this_00;
  long lVar1;
  char cVar2;
  undefined1 uVar3;
  int iVar4;
  uint uVar5;
  undefined4 uVar6;
  long lVar7;
  long *plVar8;
  long lVar9;
  QMetaType QVar10;
  pointer pQVar11;
  char *pcVar12;
  char16_t *pcVar13;
  long in_FS_OFFSET;
  QArrayData *local_78 [3];
  QSqlError local_60 [8];
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&this->field_0x8;
  lVar7 = QSqlResult::driver();
  if (lVar7 != 0) {
    plVar8 = (long *)QSqlResult::driver();
    cVar2 = (**(code **)(*plVar8 + 0x60))(plVar8);
    if (cVar2 != '\0') {
      QSqlResult::driver();
      cVar2 = QSqlDriver::isOpenError();
      if (cVar2 == '\0') {
        *(undefined1 *)(lVar1 + 0xfd) = 0;
        cleanup(this,(EVP_PKEY_CTX *)query);
        local_58.d.size = -0x5555555555555556;
        local_58.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
        local_58.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
        QString::toUtf8_helper(&local_58);
        pcVar13 = local_58.d.ptr;
        if (local_58.d.ptr == (char16_t *)0x0) {
          pcVar13 = (char16_t *)&QByteArray::_empty;
        }
        iVar4 = mysql_real_query(*(undefined8 *)(*(long *)(*(long *)(lVar1 + 0x18) + 8) + 0xa8),
                                 pcVar13,local_58.d.size);
        if (iVar4 == 0) {
          lVar7 = mysql_store_result(*(undefined8 *)(*(long *)(*(long *)(lVar1 + 0x18) + 8) + 0xa8))
          ;
          *(long *)(lVar1 + 0xb0) = lVar7;
          if ((lVar7 == 0) &&
             (iVar4 = mysql_field_count(*(undefined8 *)
                                         (*(long *)(*(long *)(lVar1 + 0x18) + 8) + 0xa8)),
             iVar4 != 0)) {
            pcVar12 = "Unable to store result";
            goto LAB_0010ab1e;
          }
          uVar5 = mysql_field_count(*(undefined8 *)(*(long *)(*(long *)(lVar1 + 0x18) + 8) + 0xa8));
          (**(code **)(*(long *)this + 0x38))(this,uVar5 != 0);
          this_00 = (QList<QMYSQLResultPrivate::QMyField> *)(lVar1 + 0xc0);
          QList<QMYSQLResultPrivate::QMyField>::resize(this_00,(long)(int)uVar5);
          uVar6 = mysql_affected_rows(*(undefined8 *)(*(long *)(*(long *)(lVar1 + 0x18) + 8) + 0xa8)
                                     );
          *(undefined4 *)(lVar1 + 0xf8) = uVar6;
          cVar2 = QSqlResult::isSelect();
          if (cVar2 != '\0') {
            if (0 < (int)uVar5) {
              lVar7 = 0;
              iVar4 = 0;
              do {
                lVar9 = mysql_fetch_field_direct(*(undefined8 *)(lVar1 + 0xb0),iVar4);
                QVar10 = qDecodeMYSQLType(*(enum_field_types *)(lVar9 + 0x70),*(uint *)(lVar9 + 100)
                                         );
                pQVar11 = QList<QMYSQLResultPrivate::QMyField>::data(this_00);
                *(QMetaTypeInterface **)((long)&(pQVar11->type).d_ptr + lVar7) = QVar10.d_ptr;
                pQVar11 = QList<QMYSQLResultPrivate::QMyField>::data(this_00);
                *(long *)((long)&pQVar11->myField + lVar7) = lVar9;
                iVar4 = iVar4 + 1;
                lVar7 = lVar7 + 0x28;
              } while ((ulong)uVar5 * 0x28 != lVar7);
            }
            (**(code **)(*(long *)this + 0x18))(this,0xffffffff);
          }
          (**(code **)(*(long *)this + 0x20))(this,1);
          uVar3 = QSqlResult::isActive();
        }
        else {
          pcVar12 = "Unable to execute query";
LAB_0010ab1e:
          QCoreApplication::translate((char *)local_78,"QMYSQLResult",pcVar12,0);
          qMakeError((QString *)local_60,(ErrorType)local_78,(QMYSQLDriverPrivate *)0x2);
          (**(code **)(*(long *)this + 0x28))(this,local_60);
          QSqlError::~QSqlError(local_60);
          if (local_78[0] != (QArrayData *)0x0) {
            LOCK();
            (local_78[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_78[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_78[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_78[0],2,0x10);
            }
          }
          uVar3 = 0;
        }
        if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
          }
        }
        goto LAB_0010aa79;
      }
    }
  }
  uVar3 = 0;
LAB_0010aa79:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (bool)uVar3;
}

Assistant:

bool QMYSQLResult::reset (const QString& query)
{
    Q_D(QMYSQLResult);
    if (!driver() || !driver()->isOpen() || driver()->isOpenError())
        return false;

    d->preparedQuery = false;

    cleanup();

    const QByteArray encQuery = query.toUtf8();
    if (mysql_real_query(d->drv_d_func()->mysql, encQuery.data(), encQuery.size())) {
        setLastError(qMakeError(QCoreApplication::translate("QMYSQLResult", "Unable to execute query"),
                     QSqlError::StatementError, d->drv_d_func()));
        return false;
    }
    d->result = mysql_store_result(d->drv_d_func()->mysql);
    if (!d->result && mysql_field_count(d->drv_d_func()->mysql) > 0) {
        setLastError(qMakeError(QCoreApplication::translate("QMYSQLResult", "Unable to store result"),
                    QSqlError::StatementError, d->drv_d_func()));
        return false;
    }
    int numFields = mysql_field_count(d->drv_d_func()->mysql);
    setSelect(numFields != 0);
    d->fields.resize(numFields);
    d->rowsAffected = mysql_affected_rows(d->drv_d_func()->mysql);

    if (isSelect()) {
        for(int i = 0; i < numFields; i++) {
            MYSQL_FIELD* field = mysql_fetch_field_direct(d->result, i);
            d->fields[i].type = qDecodeMYSQLType(field->type, field->flags);
            d->fields[i].myField = field;
        }
        setAt(QSql::BeforeFirstRow);
    }
    setActive(true);
    return isActive();
}